

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_texture_file_types.cpp
# Opt level: O0

char * crnlib::texture_file_types::get_extension(format fmt)

{
  char *pcStack_10;
  format fmt_local;
  
  if (fmt < cNumFileFormats) {
    pcStack_10 = get_extension::extensions[fmt];
  }
  else {
    pcStack_10 = (char *)0x0;
  }
  return pcStack_10;
}

Assistant:

const char* texture_file_types::get_extension(format fmt)
    {
        CRNLIB_ASSERT(fmt < cNumFileFormats);
        if (fmt >= cNumFileFormats)
        {
            return nullptr;
        }

        static const char* extensions[cNumFileFormats] = {
            "dds",
            "crn",
            "ktx",

            "tga",
            "png",
            "jpg",
            "jpeg",
            "bmp",
            "gif",
            "tif",
            "tiff",
            "ppm",
            "pgm",
            "psd",
            "jp2",

            "<clipboard>",
            "<dragdrop>"
        };
        return extensions[fmt];
    }